

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O0

void update_box(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize,boxptr boxp)

{
  hist3d ppahVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long local_70;
  long ccount;
  int dist2;
  int dist1;
  int dist0;
  int c2max;
  int c2min;
  int c1max;
  int c1min;
  int c0max;
  int c0min;
  int c2;
  int c1;
  int c0;
  histptr histp;
  hist3d histogram;
  boxptr boxp_local;
  my_cquantize_ptr cquantize_local;
  gdImagePtr nim_local;
  gdImagePtr oim_local;
  
  ppahVar1 = cquantize->histogram;
  c1min = boxp->c0min;
  c1max = boxp->c0max;
  c2min = boxp->c1min;
  c2max = boxp->c1max;
  dist0 = boxp->c2min;
  dist1 = boxp->c2max;
  c2 = c1min;
  if (c1min < c1max) {
    for (; c0min = c2min, c2 <= c1max; c2 = c2 + 1) {
      for (; c0min <= c2max; c0min = c0min + 1) {
        _c1 = ppahVar1[c2][c0min] + dist0;
        for (c0max = dist0; c0max <= dist1; c0max = c0max + 1) {
          if (*_c1 != 0) {
            c1min = c2;
            boxp->c0min = c2;
            goto LAB_00132d1c;
          }
          _c1 = _c1 + 1;
        }
      }
    }
  }
LAB_00132d1c:
  c2 = c1max;
  if (c1min < c1max) {
    for (; c0min = c2min, c1min <= c2; c2 = c2 + -1) {
      for (; c0min <= c2max; c0min = c0min + 1) {
        _c1 = ppahVar1[c2][c0min] + dist0;
        for (c0max = dist0; c0max <= dist1; c0max = c0max + 1) {
          if (*_c1 != 0) {
            c1max = c2;
            boxp->c0max = c2;
            goto LAB_00132dcf;
          }
          _c1 = _c1 + 1;
        }
      }
    }
  }
LAB_00132dcf:
  c0min = c2min;
  if (c2min < c2max) {
    for (; c0min <= c2max; c0min = c0min + 1) {
      for (c2 = c1min; c2 <= c1max; c2 = c2 + 1) {
        _c1 = ppahVar1[c2][c0min] + dist0;
        for (c0max = dist0; c0max <= dist1; c0max = c0max + 1) {
          if (*_c1 != 0) {
            c2min = c0min;
            boxp->c1min = c0min;
            goto LAB_00132e82;
          }
          _c1 = _c1 + 1;
        }
      }
    }
  }
LAB_00132e82:
  c0min = c2max;
  if (c2min < c2max) {
    for (; c2min <= c0min; c0min = c0min + -1) {
      for (c2 = c1min; c2 <= c1max; c2 = c2 + 1) {
        _c1 = ppahVar1[c2][c0min] + dist0;
        for (c0max = dist0; c0max <= dist1; c0max = c0max + 1) {
          if (*_c1 != 0) {
            c2max = c0min;
            boxp->c1max = c0min;
            goto LAB_00132f35;
          }
          _c1 = _c1 + 1;
        }
      }
    }
  }
LAB_00132f35:
  c0max = dist0;
  if (dist0 < dist1) {
    for (; c0max <= dist1; c0max = c0max + 1) {
      for (c2 = c1min; c2 <= c1max; c2 = c2 + 1) {
        _c1 = ppahVar1[c2][c2min] + c0max;
        for (c0min = c2min; c0min <= c2max; c0min = c0min + 1) {
          if (*_c1 != 0) {
            dist0 = c0max;
            boxp->c2min = c0max;
            goto LAB_00132fe9;
          }
          _c1 = _c1 + 0x20;
        }
      }
    }
  }
LAB_00132fe9:
  c0max = dist1;
  if (dist0 < dist1) {
    for (; dist0 <= c0max; c0max = c0max + -1) {
      for (c2 = c1min; c2 <= c1max; c2 = c2 + 1) {
        _c1 = ppahVar1[c2][c2min] + c0max;
        for (c0min = c2min; c0min <= c2max; c0min = c0min + 1) {
          if (*_c1 != 0) {
            dist1 = c0max;
            boxp->c2max = c0max;
            goto LAB_0013309d;
          }
          _c1 = _c1 + 0x20;
        }
      }
    }
  }
LAB_0013309d:
  iVar2 = (c1max - c1min) * 0x10;
  iVar3 = (c2max - c2min) * 0xc;
  iVar4 = (dist1 - dist0) * 8;
  boxp->volume = iVar2 * iVar2 + iVar3 * iVar3 + iVar4 * iVar4;
  local_70 = 0;
  for (c2 = c1min; c2 <= c1max; c2 = c2 + 1) {
    for (c0min = c2min; c0min <= c2max; c0min = c0min + 1) {
      _c1 = ppahVar1[c2][c0min] + dist0;
      for (c0max = dist0; c0max <= dist1; c0max = c0max + 1) {
        if (*_c1 != 0) {
          local_70 = local_70 + 1;
        }
        _c1 = _c1 + 1;
      }
    }
  }
  boxp->colorcount = local_70;
  return;
}

Assistant:

LOCAL (void)
update_box (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize, boxptr boxp)
{
	hist3d histogram = cquantize->histogram;
	histptr histp;
	int c0, c1, c2;
	int c0min, c0max, c1min, c1max, c2min, c2max;
	INT32 dist0, dist1, dist2;
	long ccount;
	(void)oim;
	(void)nim;

	c0min = boxp->c0min;
	c0max = boxp->c0max;
	c1min = boxp->c1min;
	c1max = boxp->c1max;
	c2min = boxp->c2min;
	c2max = boxp->c2max;

	if (c0max > c0min)
		for (c0 = c0min; c0 <= c0max; c0++)
			for (c1 = c1min; c1 <= c1max; c1++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c0min = c0min = c0;
						goto have_c0min;
					}
			}
have_c0min:
	if (c0max > c0min)
		for (c0 = c0max; c0 >= c0min; c0--)
			for (c1 = c1min; c1 <= c1max; c1++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c0max = c0max = c0;
						goto have_c0max;
					}
			}
have_c0max:
	if (c1max > c1min)
		for (c1 = c1min; c1 <= c1max; c1++)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c1min = c1min = c1;
						goto have_c1min;
					}
			}
have_c1min:
	if (c1max > c1min)
		for (c1 = c1max; c1 >= c1min; c1--)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c1max = c1max = c1;
						goto have_c1max;
					}
			}
have_c1max:
	if (c2max > c2min)
		for (c2 = c2min; c2 <= c2max; c2++)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1min][c2];
				for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
					if (*histp != 0) {
						boxp->c2min = c2min = c2;
						goto have_c2min;
					}
			}
have_c2min:
	if (c2max > c2min)
		for (c2 = c2max; c2 >= c2min; c2--)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1min][c2];
				for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
					if (*histp != 0) {
						boxp->c2max = c2max = c2;
						goto have_c2max;
					}
			}
have_c2max:

	/* Update box volume.
	 * We use 2-norm rather than real volume here; this biases the method
	 * against making long narrow boxes, and it has the side benefit that
	 * a box is splittable iff norm > 0.
	 * Since the differences are expressed in histogram-cell units,
	 * we have to shift back to JSAMPLE units to get consistent distances;
	 * after which, we scale according to the selected distance scale factors.
	 */
	dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
	dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
	dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
	boxp->volume = dist0 * dist0 + dist1 * dist1 + dist2 * dist2;

	/* Now scan remaining volume of box and compute population */
	ccount = 0;
	for (c0 = c0min; c0 <= c0max; c0++)
		for (c1 = c1min; c1 <= c1max; c1++) {
			histp = &histogram[c0][c1][c2min];
			for (c2 = c2min; c2 <= c2max; c2++, histp++)
				if (*histp != 0) {
					ccount++;
				}
		}
	boxp->colorcount = ccount;
}